

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall
TasGrid::GridSequence::loadConstructedPoint
          (GridSequence *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  allocator<double> *this_00;
  int iVar1;
  bool bVar2;
  double *pdVar3;
  pointer pSVar4;
  NodeData local_108;
  double *local_d8;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  allocator<double> local_a1;
  undefined1 local_a0 [8];
  vector<double,_std::allocator<double>_> surplus;
  undefined1 local_80 [8];
  vector<double,_std::allocator<double>_> approx_value;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> scratch;
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> *y_local;
  double *x_local;
  GridSequence *this_local;
  
  getMultiIndex((vector<int,_std::allocator<int>_> *)
                &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,this,x);
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<int>::allocator(&local_51);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)iVar1,&local_51);
  ::std::allocator<int>::~allocator(&local_51);
  bVar2 = MultiIndexManipulations::isLowerComplete
                    ((vector<int,_std::allocator<int>_> *)
                     &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     &(this->super_BaseCanonicalGrid).points,
                     (vector<int,_std::allocator<int>_> *)local_50);
  if (bVar2) {
    iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    this_00 = (allocator<double> *)
              ((long)&surplus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<double>::allocator(this_00);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_80,(long)iVar1,this_00);
    ::std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&surplus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::allocator<double>::allocator(&local_a1);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_a0,(long)iVar1,&local_a1);
    ::std::allocator<double>::~allocator(&local_a1);
    bVar2 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
    if (!bVar2) {
      pdVar3 = ::std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)local_80);
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])(this,x,pdVar3);
      local_b0 = (double *)
                 ::std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_80);
      local_b8 = (double *)
                 ::std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)local_80);
      local_c0 = (double *)
                 ::std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)y);
      local_c8 = (double *)
                 ::std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_a0);
      local_d8 = (double *)
                 ::std::
                 transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::GridSequence::loadConstructedPoint(double_const*,std::vector<double,std::allocator<double>>const&)::__0>
                           (local_b0,local_b8,local_c0,local_c8);
    }
    expandGrid(this,(vector<int,_std::allocator<int>_> *)
                    &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,y,
               (vector<double,_std::allocator<double>_> *)local_a0);
    pSVar4 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::removeIndex
              (&pSVar4->initial_points,
               (vector<int,_std::allocator<int>_> *)
               &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    loadConstructedPoints(this);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_a0);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_80);
  }
  else {
    pSVar4 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_108.point,
               (vector<int,_std::allocator<int>_> *)
               &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_108.value,(vector<double,_std::allocator<double>_> *)y);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar4->data,&local_108);
    NodeData::~NodeData(&local_108);
    pSVar4 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::removeIndex
              (&pSVar4->initial_points,
               (vector<int,_std::allocator<int>_> *)
               &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  ::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &scratch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void GridSequence::loadConstructedPoint(const double x[], const std::vector<double> &y){
    std::vector<int> p = getMultiIndex(x);
    std::vector<int> scratch(num_dimensions);

    if (MultiIndexManipulations::isLowerComplete(p, points, scratch)){
        std::vector<double> approx_value(num_outputs), surplus(num_outputs);;
        if (!points.empty()){
            evaluate(x, approx_value.data());
            std::transform(approx_value.begin(), approx_value.end(), y.begin(), surplus.begin(), [&](double e, double v)->double{ return v - e; });
        }
        expandGrid(p, y, surplus);
        dynamic_values->initial_points.removeIndex(p);

        loadConstructedPoints(); // batch operation, if the new point has unleashed a bunch of previously available ones
    }else{
        dynamic_values->data.push_front({p, y});
        dynamic_values->initial_points.removeIndex(p);
    }
}